

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMRangeImpl.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::DOMRangeImpl::updateRangeForDeletedNode(DOMRangeImpl *this,DOMNode *node)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  XMLSize_t XVar3;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  DOMNode *tpNode_1;
  DOMNode *tpNode;
  XMLSize_t index_1;
  XMLSize_t index;
  DOMNode *node_local;
  DOMRangeImpl *this_local;
  
  if ((node != (DOMNode *)0x0) && (this->fRemoveChild != node)) {
    iVar2 = (*node->_vptr_DOMNode[5])();
    if (((DOMNode *)CONCAT44(extraout_var,iVar2) == this->fStartContainer) &&
       (XVar3 = indexOf(this,node,this->fStartContainer), XVar3 < this->fStartOffset)) {
      this->fStartOffset = this->fStartOffset - 1;
    }
    iVar2 = (*node->_vptr_DOMNode[5])();
    if (((DOMNode *)CONCAT44(extraout_var_00,iVar2) == this->fEndContainer) &&
       (XVar3 = indexOf(this,node,this->fEndContainer), XVar3 < this->fEndOffset)) {
      this->fEndOffset = this->fEndOffset - 1;
    }
    iVar2 = (*node->_vptr_DOMNode[5])();
    if (((DOMNode *)CONCAT44(extraout_var_01,iVar2) != this->fStartContainer) ||
       (iVar2 = (*node->_vptr_DOMNode[5])(),
       (DOMNode *)CONCAT44(extraout_var_02,iVar2) != this->fEndContainer)) {
      bVar1 = isAncestorOf(node,this->fStartContainer);
      if (bVar1) {
        iVar2 = (*node->_vptr_DOMNode[5])();
        setStartContainer(this,(DOMNode *)CONCAT44(extraout_var_03,iVar2));
        XVar3 = indexOf(this,node,(DOMNode *)CONCAT44(extraout_var_03,iVar2));
        this->fStartOffset = XVar3;
      }
      bVar1 = isAncestorOf(node,this->fEndContainer);
      if (bVar1) {
        iVar2 = (*node->_vptr_DOMNode[5])();
        setEndContainer(this,(DOMNode *)CONCAT44(extraout_var_04,iVar2));
        XVar3 = indexOf(this,node,(DOMNode *)CONCAT44(extraout_var_04,iVar2));
        this->fEndOffset = XVar3;
      }
    }
  }
  return;
}

Assistant:

void DOMRangeImpl::updateRangeForDeletedNode(DOMNode* node)
{

    if (node == 0) return;
    if (fRemoveChild == node) return;

    if (node->getParentNode() == fStartContainer) {
        XMLSize_t index = indexOf(node, fStartContainer);
        if ( fStartOffset > index) {
            fStartOffset--;
        }
    }

    if (node->getParentNode() == fEndContainer) {
        XMLSize_t index = indexOf(node, fEndContainer);
        if ( fEndOffset > index) {
            fEndOffset--;
        }
    }

    if (node->getParentNode() != fStartContainer
        ||  node->getParentNode() != fEndContainer) {
        if (isAncestorOf(node, fStartContainer)) {
            DOMNode* tpNode = node->getParentNode();
            setStartContainer( tpNode );
            fStartOffset = indexOf( node, tpNode);
        }
        if (isAncestorOf(node, fEndContainer)) {
            DOMNode* tpNode = node->getParentNode();
            setEndContainer( tpNode );
            fEndOffset = indexOf( node, tpNode);
        }
    }

}